

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall wasm::DataFlow::Printer::printInternal(Printer *this,Node *node)

{
  Const *pCVar1;
  ostream *poVar2;
  Literal local_38;
  Node *local_20;
  
  local_20 = getMaybeReplaced(this,node);
  if (local_20 != (Node *)0x0) {
    if ((local_20->type == Expr) && (((local_20->field_1).expr)->_id == ConstId)) {
      pCVar1 = Expression::cast<wasm::Const>((local_20->field_1).expr);
      Literal::Literal(&local_38,&pCVar1->value);
      print(this,&local_38);
      Literal::~Literal(&local_38);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"%");
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_20);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                ,0x20e,"void wasm::DataFlow::Printer::printInternal(Node *)");
}

Assistant:

void printInternal(Node* node) {
    node = getMaybeReplaced(node);
    assert(node);
    if (node->isConst()) {
      print(node->expr->cast<Const>()->value);
    } else {
      std::cout << "%" << indexing[node];
    }
  }